

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O3

void av1_single_motion_search
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int ref_idx,int *rate_mv,
               int search_range,inter_mode_info *mode_info,int_mv *best_mv,HandleInterModeArgs *args
               )

{
  MACROBLOCKD *pMVar1;
  AV1_COMMON *cm;
  MV start_mv;
  undefined8 *puVar2;
  BLOCK_SIZE BVar3;
  byte bVar4;
  byte bVar5;
  FULLPEL_MV FVar6;
  MB_MODE_INFO *pMVar7;
  ushort uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  YV12_BUFFER_CONFIG *src;
  ulong uVar17;
  uint uVar18;
  search_site_config *psVar19;
  SEARCH_METHODS *pSVar20;
  av1_init_search_site_config *pp_Var21;
  int *piVar22;
  buf_2d *pbVar23;
  ulong uVar24;
  long lVar25;
  short sVar26;
  uint uVar27;
  short sVar28;
  ulong uVar29;
  int iVar30;
  uint uVar31;
  byte bVar32;
  long lVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  int_mv *piVar37;
  uint local_560;
  MV ref_mv;
  int local_544;
  long local_540;
  MV this_best_mv;
  int dis;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  int local_518;
  int local_514;
  MACROBLOCKD *local_510;
  ulong local_508;
  undefined8 local_500;
  uint *local_4f8;
  MvCosts *local_4f0;
  int_mv (*local_4e8) [7];
  uint sse;
  ulong local_4d8;
  ulong local_4d0;
  search_site_config *local_4c8;
  FULLPEL_MV_STATS best_mv_stats;
  int_mv fractional_ms_list [3];
  BUFFER_SET orig_dst;
  int cost_list [5];
  RD_STATS this_rd_stats;
  buf_2d backup_yv12 [3];
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  cand_mv_t cand [65];
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  
  local_4f8 = (uint *)CONCAT44(local_4f8._4_4_,search_range);
  pMVar1 = &x->e_mbd;
  uVar31 = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
  uVar17 = (ulong)uVar31;
  pMVar7 = *(x->e_mbd).mi;
  backup_yv12[2].width = 0;
  backup_yv12[2].height = 0;
  backup_yv12[2].stride = 0;
  backup_yv12[2]._28_4_ = 0;
  backup_yv12[2].buf = (uint8_t *)0x0;
  backup_yv12[2].buf0 = (uint8_t *)0x0;
  backup_yv12[1].width = 0;
  backup_yv12[1].height = 0;
  backup_yv12[1].stride = 0;
  backup_yv12[1]._28_4_ = 0;
  backup_yv12[1].buf = (uint8_t *)0x0;
  backup_yv12[1].buf0 = (uint8_t *)0x0;
  backup_yv12[0].width = 0;
  backup_yv12[0].height = 0;
  backup_yv12[0].stride = 0;
  backup_yv12[0]._28_4_ = 0;
  backup_yv12[0].buf = (uint8_t *)0x0;
  backup_yv12[0].buf0 = (uint8_t *)0x0;
  lVar33 = (long)(int)pMVar7->ref_frame[ref_idx];
  src = av1_get_scaled_ref_frame(cpi,(int)pMVar7->ref_frame[ref_idx]);
  local_514 = (x->e_mbd).mi_row;
  local_518 = (x->e_mbd).mi_col;
  local_4f0 = x->mv_costs;
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar23 = backup_yv12;
    lVar25 = 0;
    do {
      puVar2 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[ref_idx].buf + lVar25);
      puVar9 = (uint8_t *)*puVar2;
      puVar10 = (uint8_t *)puVar2[1];
      puVar2 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[ref_idx].width + lVar25);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      pbVar23->width = (int)uVar11;
      pbVar23->height = (int)((ulong)uVar11 >> 0x20);
      *(undefined8 *)&pbVar23->stride = uVar12;
      pbVar23->buf = puVar9;
      pbVar23->buf0 = puVar10;
      pbVar23 = pbVar23 + 1;
      lVar25 = lVar25 + 0xa30;
    } while (uVar17 * 0xa30 - lVar25 != 0);
    av1_setup_pre_planes(pMVar1,ref_idx,src,local_514,local_518,(scale_factors *)0x0,uVar31);
  }
  local_540 = lVar33;
  local_530 = uVar17;
  local_510 = pMVar1;
  if (((cpi->sf).mv_sf.auto_mv_step_size == 0) || ((cpi->common).show_frame == 0)) {
    uVar31 = (cpi->mv_search_params).mv_step_param;
  }
  else {
    iVar13 = av1_init_search_range(x->max_mv_context[lVar33]);
    uVar31 = (iVar13 + (cpi->mv_search_params).mv_step_param) / 2;
  }
  lVar33 = local_540;
  ref_mv = (MV)av1_get_ref_mv(x,ref_idx);
  local_520 = (ulong)bsize;
  if (pMVar7->motion_mode == '\0') {
    uVar14 = (int)ref_mv.row + (uint)(-1 < ref_mv.row) + 3 >> 3 & 0xffff |
             (((int)ref_mv >> 0x10) - ((int)~(uint)ref_mv >> 0x1f)) * 0x2000 + 0x6000U & 0xffff0000;
    uVar17 = 0;
    memset(cand,0,0x208);
    local_4d8 = CONCAT44(local_4d8._4_4_,uVar14);
    cand[0].fmv.as_int = uVar14;
    local_544 = 1;
    if (((cpi->sf).mv_sf.full_pixel_search_level == 0) && ((x->sb_enc).tpl_data_count != 0)) {
      bVar5 = (cpi->ppi->tpl_data).tpl_bsize_1d;
      if (bVar5 < 0x10) {
        if (bVar5 == 4) {
          lVar25 = 0;
        }
        else {
          if (bVar5 != 8) goto LAB_003c1026;
          lVar25 = 3;
        }
      }
      else if (bVar5 == 0x10) {
LAB_003c1026:
        lVar25 = 6;
      }
      else {
        lVar25 = 0xc;
        if (bVar5 != 0x40) {
          if (bVar5 != 0x20) goto LAB_003c1026;
          lVar25 = 9;
        }
      }
      bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[lVar25];
      bVar32 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[lVar25];
      if (bVar32 <= "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [local_520] &&
          bVar5 <= "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [local_520]) {
        iVar13 = (x->e_mbd).mi_col;
        BVar3 = ((cpi->common).seq_params)->sb_size;
        bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar3];
        uVar27 = (uint)(short)((short)((x->e_mbd).mi_row %
                                      (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                                 [BVar3]) / (short)(ushort)bVar32);
        local_528 = (ulong)uVar27;
        iVar36 = (x->sb_enc).tpl_stride;
        uVar18 = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [local_520] / bVar32);
        uVar14 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [local_520] / bVar5);
        iVar16 = uVar18 * uVar14;
        cand[0].weight = iVar16;
        local_4e8 = (x->sb_enc).tpl_mv;
        local_4c8 = (search_site_config *)(ulong)uVar14;
        uVar14 = 0;
        do {
          psVar19 = (search_site_config *)0x0;
          do {
            iVar15 = (uVar14 + uVar27) * iVar36 +
                     (int)(short)((short)(iVar13 % (int)(uint)bVar4) / (short)(ushort)bVar5) +
                     (int)psVar19;
            sVar26 = local_4e8[(long)iVar15 + -1][lVar33 + 6].as_mv.row;
            sVar28 = *(short *)((long)local_4e8[(long)iVar15 + -1] + lVar33 * 4 + 0x1a);
            if (CONCAT22(sVar28,sVar26) == -0x7fff8000) {
              uVar17 = 0;
              goto LAB_003c12ba;
            }
            lVar25 = 1;
            sVar26 = (short)((uint)(-1 < sVar26) + (int)sVar26 + 3 >> 3);
            sVar28 = (short)((int)sVar28 + (uint)(-1 < sVar28) + 3 >> 3);
            piVar22 = &cand[0].weight;
            do {
              uVar34 = (uint)(((cand_mv_t *)(piVar22 + -1))->fmv).as_mv.row;
              if ((((uVar34 - ((int)~uVar34 >> 0x1f)) + 3 ^
                   ((int)sVar26 - (~(int)sVar26 >> 0x1f)) + 3U) < 8) &&
                 ((((int)*(short *)((long)piVar22 + -2) -
                   (~(int)*(short *)((long)piVar22 + -2) >> 0x1f)) + 3U ^
                  ((int)sVar28 - (~(int)sVar28 >> 0x1f)) + 3U) < 8)) {
                iVar15 = *piVar22;
                goto LAB_003c123e;
              }
              piVar22 = piVar22 + 2;
              lVar25 = lVar25 + -1;
            } while (lVar25 != 0);
            cand[1].fmv.as_mv.row = sVar26;
            cand[1].fmv.as_mv.col = sVar28;
            cand[1].weight = 1;
            piVar22 = &local_544;
            iVar15 = local_544;
LAB_003c123e:
            *piVar22 = iVar15 + 1;
            psVar19 = (search_site_config *)((long)&psVar19->site[0][0].mv.row + 1);
          } while (psVar19 < local_4c8);
          uVar14 = uVar14 + 1;
        } while (uVar14 < uVar18);
        uVar17 = (ulong)(uint)(iVar16 * 2);
      }
    }
  }
  else {
    uVar14 = (uint)pMVar7->mv[0].as_mv.row;
    uVar18 = (uint)pMVar7->mv[0].as_mv.col;
    uVar14 = (uVar14 - ((int)~uVar14 >> 0x1f)) + 3 >> 3 & 0xffff |
             (uVar18 - ((int)~uVar18 >> 0x1f)) * 0x2000 + 0x6000 & 0xffff0000;
    uVar17 = 0;
    memset(cand,0,0x208);
    local_4d8 = CONCAT44(local_4d8._4_4_,uVar14);
    cand[0].fmv.as_int = uVar14;
  }
LAB_003c12ba:
  local_544 = 1;
  local_500 = 1;
  local_508 = CONCAT44(local_508._4_4_,1);
  if (((cpi->sf).mv_sf.skip_fullpel_search_using_startmv != 0) && (pMVar7->motion_mode == '\0')) {
    uVar14 = args->start_mv_cnt;
    lVar25 = 0;
    uVar18 = uVar14;
    do {
      if (0 < (int)uVar14) {
        uVar29 = 0;
        do {
          uVar34 = (int)args->start_mv_stack[uVar29].row - (int)cand[lVar25].fmv.as_mv.row;
          uVar27 = -uVar34;
          if (0 < (int)uVar34) {
            uVar27 = uVar34;
          }
          uVar35 = (int)args->start_mv_stack[uVar29].col - (int)cand[lVar25].fmv.as_mv.col;
          uVar34 = -uVar35;
          if (0 < (int)uVar35) {
            uVar34 = uVar35;
          }
          if (args->single_newmv_valid[args->ref_mv_idx_stack[uVar29]][lVar33] != 0) {
            iVar13 = (cpi->sf).mv_sf.skip_fullpel_search_using_startmv;
            lVar33 = local_540;
            if (iVar13 < 2) {
              if (iVar13 == 1) {
                uVar34 = uVar34 + uVar27;
                goto LAB_003c13a3;
              }
            }
            else if (uVar27 < 2) {
LAB_003c13a3:
              if (uVar34 < 2) {
                cand[lVar25].fmv.as_int = 0x80008000;
                goto LAB_003c1414;
              }
            }
          }
          uVar29 = uVar29 + 1;
        } while (uVar14 != uVar29);
      }
      if ((*(ushort *)&pMVar7->field_0xa7 & 0x30) != 0x20) {
        *(int_mv *)(args->start_mv_stack + (int)uVar18) = cand[lVar25].fmv;
        args->ref_mv_idx_stack[args->start_mv_cnt] = (byte)pMVar7->field_0xa7 >> 4 & 3;
        uVar18 = args->start_mv_cnt + 1;
        args->start_mv_cnt = uVar18;
      }
LAB_003c1414:
      lVar25 = lVar25 + 1;
    } while (lVar25 != 1);
  }
  bVar32 = (cpi->sf).mv_sf.search_method;
  iVar13 = (cpi->sf).mv_sf.use_bsize_dependent_search_method;
  bVar5 = block_size_high[local_520];
  if (block_size_wide[local_520] < block_size_high[local_520]) {
    bVar5 = block_size_wide[local_520];
  }
  if ((iVar13 == 1 && 0x1f < bVar5) ||
     (((pSVar20 = (SEARCH_METHODS *)0x0, 0xf < bVar5 && 1 < iVar13 &&
       ((x->content_state_sb).source_sad_nonrd < kHighSad)) && (x->qindex < 0xc0)))) {
    pSVar20 = (SEARCH_METHODS *)0x0;
    if (bVar32 < 0xb) {
      pSVar20 = &DAT_0055f580;
      bVar32 = (&DAT_0055f580)[bVar32];
    }
    else {
      bVar32 = 0;
    }
  }
  iVar13 = (x->e_mbd).plane[0].pre[0].stride;
  local_4d0 = uVar17;
  if (iVar13 == (cpi->mv_search_params).search_site_cfg[0][0].stride) {
    psVar19 = (cpi->mv_search_params).search_site_cfg[0];
  }
  else if (iVar13 == (cpi->mv_search_params).search_site_cfg[1][0].stride) {
    psVar19 = (cpi->mv_search_params).search_site_cfg[1];
  }
  else {
    pSVar20 = (SEARCH_METHODS *)(ulong)""[bVar32];
    psVar19 = x->search_site_cfg_buf;
    if (iVar13 != x->search_site_cfg_buf[(long)pSVar20].stride) {
      pp_Var21 = av1_init_motion_compensation;
      (*av1_init_motion_compensation[""[(long)pSVar20]])
                (psVar19 + ""[(long)pSVar20],iVar13,SUB14((bVar32 & 0xfe) == 2,0));
      pSVar20 = (SEARCH_METHODS *)pp_Var21;
    }
  }
  if ((int)local_4f8 != 0x7fffffff) {
    pSVar20 = "";
    bVar5 = ""[bVar32];
    if ((int)local_4f8 < 1) {
      uVar31 = psVar19[bVar5].num_search_steps;
    }
    else {
      pSVar20 = (SEARCH_METHODS *)(ulong)(~uVar31 + psVar19[bVar5].num_search_steps);
      uVar31 = uVar31 - 1;
      do {
        iVar36 = (int)pSVar20;
        uVar31 = uVar31 + 1;
        iVar13 = psVar19[bVar5].radius[iVar36];
        if (iVar13 == (int)local_4f8 * 2 ||
            SBORROW4(iVar13,(int)local_4f8 * 2) != iVar13 + (int)local_4f8 * -2 < 0) break;
        pSVar20 = (SEARCH_METHODS *)(ulong)(iVar36 - 1);
      } while (0 < iVar36);
    }
  }
  best_mv->as_int = 0x80008000;
  local_4e8 = (int_mv (*) [7])0x0;
  if ((cpi->is_screen_content_type != 0) &&
     (pSVar20 = (SEARCH_METHODS *)(ulong)cpi->gf_frame_index,
     (cpi->ppi->gf_group).update_type[(long)pSVar20] == '\x03')) {
    local_4e8 = (int_mv (*) [7])(ulong)((cpi->oxcf).speed < 3);
  }
  local_528 = CONCAT62((int6)((ulong)pSVar20 >> 0x10),0x8000);
  if (pMVar7->motion_mode == '\x01') {
    FVar6 = local_4d8._0_4_;
    av1_make_default_fullpel_ms_params
              (&full_ms_params,cpi,x,(BLOCK_SIZE)local_520,&ref_mv,local_4d8._0_4_,psVar19,bVar32,
               (int)local_4e8);
    iVar13 = av1_obmc_full_pixel_search(FVar6,&full_ms_params,uVar31,&best_mv->as_fullmv);
LAB_003c17f2:
    local_560 = 0x8000;
    uVar14 = (uint)local_530;
  }
  else {
    iVar13 = 0x7fffffff;
    if (pMVar7->motion_mode != '\0') goto LAB_003c17f2;
    local_560 = 0x8000;
    uVar14 = (uint)local_530;
    if (0 < (int)local_500) {
      local_500 = CONCAT44(local_500._4_4_,(int)local_4d0 * 3);
      uVar29 = local_508 & 0xffffffff;
      local_560 = 0x8000;
      local_508 = (ulong)bVar32;
      uVar24 = 0;
      iVar36 = 0;
      local_528 = 0x8000;
      uVar17 = local_530;
      local_4d8 = uVar29;
      local_4c8 = psVar19;
      do {
        FVar6 = cand[uVar24].fmv.as_fullmv;
        if (FVar6 != (FULLPEL_MV)0x80008000) {
          local_4f8 = (uint *)CONCAT44(local_4f8._4_4_,iVar13);
          av1_make_default_fullpel_ms_params
                    (&full_ms_params,cpi,x,(BLOCK_SIZE)local_520,&ref_mv,FVar6,psVar19,
                     (SEARCH_METHODS)local_508,(int)local_4e8);
          if ((cpi->sf).mv_sf.subpel_search_method == '\0') {
            piVar22 = (int *)0x0;
          }
          else {
            piVar22 = cost_list;
            if ((cpi->sf).mv_sf.use_fullpel_costlist == 0) {
              piVar22 = (int *)0x0;
            }
          }
          iVar16 = av1_full_pixel_search
                             (FVar6,&full_ms_params,uVar31,piVar22,(FULLPEL_MV *)&orig_dst,
                              (FULLPEL_MV_STATS *)&ms_params,(FULLPEL_MV *)&this_rd_stats);
          iVar13 = (int)local_4f8;
          if (iVar16 < (int)local_4f8) {
            best_mv->as_int = (uint32_t)orig_dst.plane[0];
            best_mv_stats.sse = (uint)ms_params.cost_list;
            local_560 = this_rd_stats.rate;
            local_528 = (ulong)((uint)this_rd_stats.rate >> 0x10);
            iVar13 = iVar16;
          }
          iVar36 = iVar36 + cand[uVar24].weight;
          uVar14 = (uint)local_530;
          uVar17 = local_530;
          uVar29 = local_4d8;
          psVar19 = local_4c8;
          lVar33 = local_540;
          if ((int)local_500 < iVar36 * 4) break;
        }
        uVar14 = (uint)uVar17;
        uVar24 = uVar24 + 1;
      } while (uVar29 != uVar24);
    }
  }
  if (best_mv->as_int == 0x80008000) {
    return;
  }
  if (src != (YV12_BUFFER_CONFIG *)0x0) {
    pbVar23 = backup_yv12;
    lVar25 = 0;
    do {
      puVar9 = pbVar23->buf;
      puVar10 = pbVar23->buf0;
      uVar11 = *(undefined8 *)&pbVar23->stride;
      puVar2 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[ref_idx].width + lVar25);
      *puVar2 = *(undefined8 *)&pbVar23->width;
      puVar2[1] = uVar11;
      puVar2 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[ref_idx].buf + lVar25);
      *puVar2 = puVar9;
      puVar2[1] = puVar10;
      pbVar23 = pbVar23 + 1;
      lVar25 = lVar25 + 0xa30;
    } while ((ulong)uVar14 * 0xa30 - lVar25 != 0);
  }
  if (((1 < (cpi->sf).inter_sf.skip_newmv_in_drl) && (pMVar7->motion_mode == '\0')) &&
     (best_mv->as_int != 0x80008000)) {
    ms_params.allow_hp = (best_mv->as_int & 0x1fff1fff) << 3;
    uVar8 = *(ushort *)&pMVar7->field_0xa7 >> 4;
    uVar31 = uVar8 & 3;
    iVar36 = av1_mv_bit_cost((MV *)&ms_params,&ref_mv,local_4f0->nmv_joint_cost,
                             local_4f0->mv_cost_stack,0x6c);
    mode_info[uVar31].full_search_mv.as_int = ms_params.allow_hp;
    mode_info[uVar31].full_mv_rate = iVar36;
    mode_info[uVar31].full_mv_bestsme = iVar13;
    if ((uVar8 & 3) != 0) {
      lVar25 = 0;
      do {
        if ((ms_params.allow_hp == *(int *)((long)&mode_info->full_search_mv + lVar25)) &&
           (*(int *)((long)&mode_info->drl_cost + lVar25) +
            *(int *)((long)&mode_info->full_mv_rate + lVar25) <= mode_info[uVar31].drl_cost + iVar36
           )) {
LAB_003c1c8e:
          best_mv->as_int = 0x80008000;
          return;
        }
        iVar16 = *(int *)((long)&mode_info->full_mv_bestsme + lVar25);
        if ((iVar16 != 0x7fffffff) && (iVar15 = (cpi->sf).inter_sf.skip_newmv_in_drl, 2 < iVar15)) {
          iVar30 = iVar16 >> 2;
          if (iVar15 != 3) {
            iVar30 = 0;
          }
          if ((iVar30 + iVar16 < iVar13) &&
             (*(int *)((long)&mode_info->drl_cost + lVar25) < mode_info[uVar31].drl_cost))
          goto LAB_003c1c8e;
        }
        lVar25 = lVar25 + 0x14;
      } while ((ulong)(uVar31 << 2) * 5 != lVar25);
    }
  }
  if ((cpi->common).features.cur_frame_force_integer_mv == true) {
    best_mv->as_int =
         (uint)(ushort)(best_mv->as_mv).col * 0x80000 + ((ushort)(best_mv->as_mv).row & 0x1fff) * 8;
  }
  if ((iVar13 != 0x7fffffff) && ((cpi->common).features.cur_frame_force_integer_mv == false)) {
    cm = &cpi->common;
    fractional_ms_list[0] = (int_mv)0x80008000;
    fractional_ms_list[1] = (int_mv)0x80008000;
    fractional_ms_list[2].as_int = 0x80008000;
    av1_make_default_subpel_ms_params(&ms_params,cpi,x,(BLOCK_SIZE)local_520,&ref_mv,cost_list);
    start_mv = (MV)((uint)(ushort)(best_mv->as_mv).col * 0x80000 +
                   ((ushort)(best_mv->as_mv).row & 0x1fff) * 8);
    if (pMVar7->motion_mode == '\x01') {
      av1_find_best_obmc_sub_pixel_tree_up
                (local_510,cm,&ms_params,start_mv,(FULLPEL_MV_STATS *)0x0,&best_mv->as_mv,&dis,
                 x->pred_sse + lVar33,(int_mv *)0x0);
    }
    else if (pMVar7->motion_mode == '\0') {
      if ((cpi->sf).mv_sf.use_accurate_subpel_search == '\0') {
        piVar37 = (int_mv *)0x0;
      }
      else {
        uVar31 = local_560 & 0xffff | (int)local_528 << 0x10;
        if ((uVar31 != 0x80008000) && (uVar31 != best_mv->as_int)) {
          iVar13 = (cpi->sf).mv_sf.disable_second_mv;
          local_4f8 = x->pred_sse + local_540;
          iVar36 = (*(cpi->mv_search_params).find_fractional_mv_step)
                             (local_510,cm,&ms_params,start_mv,&best_mv_stats,(MV *)best_mv,&dis,
                              local_4f8,fractional_ms_list);
          uVar17 = local_520;
          if (iVar13 < 2) {
            lVar33 = 0x7fffffffffffffff;
            orig_dst.plane[0] = (x->e_mbd).plane[0].dst.buf;
            orig_dst.plane[1] = (x->e_mbd).plane[1].dst.buf;
            orig_dst.plane[2] = (x->e_mbd).plane[2].dst.buf;
            orig_dst.stride[0] = (x->e_mbd).plane[0].dst.stride;
            orig_dst.stride[1] = (x->e_mbd).plane[1].dst.stride;
            orig_dst.stride[2] = (x->e_mbd).plane[2].dst.stride;
            if ((cpi->sf).mv_sf.disable_second_mv == 0) {
              pMVar7->mv[0] = *best_mv;
              local_530 = CONCAT44(local_530._4_4_,iVar36);
              BVar3 = (BLOCK_SIZE)local_520;
              av1_enc_build_inter_predictor(cm,local_510,local_514,local_518,&orig_dst,BVar3,0,0);
              av1_subtract_plane(x,BVar3,0);
              this_rd_stats.rate = 0;
              this_rd_stats.zero_rate = 0;
              this_rd_stats.dist = 0;
              this_rd_stats.rdcost = 0;
              this_rd_stats.sse = 0;
              this_rd_stats.skip_txfm = '\x01';
              av1_estimate_txfm_yrd(cpi,x,&this_rd_stats,0x7fffffffffffffff,BVar3,""[uVar17]);
              iVar13 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_4f0->nmv_joint_cost,
                                       local_4f0->mv_cost_stack,0x6c);
              lVar33 = this_rd_stats.dist * 0x80 +
                       ((long)x->rdmult * ((long)iVar13 + (long)this_rd_stats.rate) + 0x100 >> 9);
              iVar36 = (int)local_530;
            }
            pMVar1 = local_510;
            iVar13 = (int)(short)((short)local_528 * 8);
            if ((ms_params.mv_limits.col_min <= iVar13) && (iVar13 <= ms_params.mv_limits.col_max))
            {
              iVar13 = (int)(short)(local_560 << 3);
              if ((ms_params.mv_limits.row_min <= iVar13) && (iVar13 <= ms_params.mv_limits.row_max)
                 ) {
                local_530 = CONCAT44(local_530._4_4_,iVar36);
                iVar13 = (*(cpi->mv_search_params).find_fractional_mv_step)
                                   (local_510,cm,&ms_params,
                                    (MV)(local_560 << 3 & 0xffff | (int)local_528 << 0x13),
                                    (FULLPEL_MV_STATS *)0x0,&this_best_mv,&dis,&sse,
                                    fractional_ms_list);
                uVar17 = local_520;
                if ((cpi->sf).mv_sf.disable_second_mv == 0) {
                  pMVar7->mv[0].as_mv = this_best_mv;
                  BVar3 = (BLOCK_SIZE)local_520;
                  av1_enc_build_inter_predictor(cm,pMVar1,local_514,local_518,&orig_dst,BVar3,0,0);
                  av1_subtract_plane(x,BVar3,0);
                  this_rd_stats.rate = 0;
                  this_rd_stats.zero_rate = 0;
                  this_rd_stats.dist = 0;
                  this_rd_stats.rdcost = 0;
                  this_rd_stats.sse = 0;
                  this_rd_stats.skip_txfm = '\x01';
                  av1_estimate_txfm_yrd(cpi,x,&this_rd_stats,0x7fffffffffffffff,BVar3,""[uVar17]);
                  iVar13 = av1_mv_bit_cost(&this_best_mv,&ref_mv,local_4f0->nmv_joint_cost,
                                           local_4f0->mv_cost_stack,0x6c);
                  if (this_rd_stats.dist * 0x80 +
                      ((long)x->rdmult * ((long)iVar13 + (long)this_rd_stats.rate) + 0x100 >> 9) <
                      lVar33) {
                    best_mv->as_mv = this_best_mv;
                    *local_4f8 = sse;
                  }
                }
                else if (iVar13 < (int)local_530) {
                  best_mv->as_mv = this_best_mv;
                  *local_4f8 = sse;
                }
              }
            }
          }
          goto LAB_003c1ba2;
        }
        piVar37 = fractional_ms_list;
      }
      (*(cpi->mv_search_params).find_fractional_mv_step)
                (local_510,cm,&ms_params,start_mv,&best_mv_stats,(MV *)best_mv,&dis,
                 x->pred_sse + local_540,piVar37);
    }
LAB_003c1ba2:
    if ((((args != (HandleInterModeArgs *)0x0) && (0 < (cpi->sf).inter_sf.skip_newmv_in_drl)) &&
        (pMVar7->motion_mode == '\0')) && (best_mv->as_int != 0x80008000)) {
      uVar8 = *(ushort *)&pMVar7->field_0xa7 >> 4;
      uVar31 = uVar8 & 3;
      iVar13 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_4f0->nmv_joint_cost,
                               local_4f0->mv_cost_stack,0x6c);
      if ((uVar8 & 3) != 0) {
        local_540 = local_540 << 2;
        lVar33 = 0;
        do {
          if (((*(int *)((long)*args->single_newmv_valid + local_540) != 0) &&
              (best_mv->as_int == *(uint32_t *)((long)*args->single_newmv + local_540))) &&
             ((*(int *)((long)&mode_info->skip + lVar33) != 0 ||
              (*(int *)((long)&mode_info->drl_cost + lVar33) +
               *(int *)((long)*args->single_newmv_rate + local_540) <=
               mode_info[uVar31].drl_cost + iVar13)))) {
            mode_info[uVar31].skip = 1;
            break;
          }
          lVar33 = lVar33 + 0x14;
          local_540 = local_540 + 0x20;
        } while ((ulong)(uVar31 << 2) * 5 != lVar33);
      }
      goto LAB_003c19ff;
    }
  }
  iVar13 = av1_mv_bit_cost(&best_mv->as_mv,&ref_mv,local_4f0->nmv_joint_cost,
                           local_4f0->mv_cost_stack,0x6c);
LAB_003c19ff:
  *rate_mv = iVar13;
  return;
}

Assistant:

void av1_single_motion_search(const AV1_COMP *const cpi, MACROBLOCK *x,
                              BLOCK_SIZE bsize, int ref_idx, int *rate_mv,
                              int search_range, inter_mode_info *mode_info,
                              int_mv *best_mv,
                              struct HandleInterModeArgs *const args) {
  MACROBLOCKD *xd = &x->e_mbd;
  const AV1_COMMON *cm = &cpi->common;
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct buf_2d backup_yv12[MAX_MB_PLANE] = { { 0, 0, 0, 0, 0 } };
  int bestsme = INT_MAX;
  const int ref = mbmi->ref_frame[ref_idx];
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const MvCosts *mv_costs = x->mv_costs;

  if (scaled_ref_frame) {
    // Swap out the reference frame for a version that's been scaled to
    // match the resolution of the current frame, allowing the existing
    // full-pixel motion search code to be used without additional
    // modifications.
    for (int i = 0; i < num_planes; i++) {
      backup_yv12[i] = xd->plane[i].pre[ref_idx];
    }
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Work out the size of the first step in the mv step search.
  // 0 here is maximum length first step. 1 is AOMMAX >> 1 etc.
  int step_param;
  if (cpi->sf.mv_sf.auto_mv_step_size && cm->show_frame) {
    // Take the weighted average of the step_params based on the last frame's
    // max mv magnitude and that based on the best ref mvs of the current
    // block for the given reference.
    step_param = (av1_init_search_range(x->max_mv_context[ref]) +
                  mv_search_params->mv_step_param) /
                 2;
  } else {
    step_param = mv_search_params->mv_step_param;
  }

  const MV ref_mv = av1_get_ref_mv(x, ref_idx).as_mv;
  FULLPEL_MV start_mv;
  if (mbmi->motion_mode != SIMPLE_TRANSLATION)
    start_mv = get_fullmv_from_mv(&mbmi->mv[0].as_mv);
  else
    start_mv = get_fullmv_from_mv(&ref_mv);

  // cand stores start_mv and all possible MVs in a SB.
  cand_mv_t cand[MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB + 1];
  av1_zero(cand);
  cand[0].fmv.as_fullmv = start_mv;
  int cnt = 1;
  int total_weight = 0;

  if (!cpi->sf.mv_sf.full_pixel_search_level &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    get_mv_candidate_from_tpl(cpi, x, bsize, ref, cand, &cnt, &total_weight);
  }

  const int cand_cnt = AOMMIN(2, cnt);
  // TODO(any): Test the speed feature for OBMC_CAUSAL mode.
  if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv &&
      mbmi->motion_mode == SIMPLE_TRANSLATION) {
    const int stack_size = args->start_mv_cnt;
    for (int cand_idx = 0; cand_idx < cand_cnt; cand_idx++) {
      int_mv *fmv_cand = &cand[cand_idx].fmv;
      int skip_cand_mv = 0;

      // Check difference between mvs in the stack and candidate mv.
      for (int stack_idx = 0; stack_idx < stack_size; stack_idx++) {
        const uint8_t this_ref_mv_idx = args->ref_mv_idx_stack[stack_idx];
        const FULLPEL_MV *fmv_stack = &args->start_mv_stack[stack_idx];
        const int this_newmv_valid =
            args->single_newmv_valid[this_ref_mv_idx][ref];
        const int row_diff = abs(fmv_stack->row - fmv_cand->as_fullmv.row);
        const int col_diff = abs(fmv_stack->col - fmv_cand->as_fullmv.col);

        if (!this_newmv_valid) continue;

        if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 2) {
          // Prunes the current start_mv candidate, if the absolute mv
          // difference of both row and column are <= 1.
          if (row_diff <= 1 && col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        } else if (cpi->sf.mv_sf.skip_fullpel_search_using_startmv >= 1) {
          // Prunes the current start_mv candidate, if the sum of the absolute
          // mv difference of row and column is <= 1.
          if (row_diff + col_diff <= 1) {
            skip_cand_mv = 1;
            break;
          }
        }
      }
      if (skip_cand_mv) {
        // Ensure atleast one full-pel motion search is not pruned.
        assert(mbmi->ref_mv_idx != 0);
        // Mark the candidate mv as invalid so that motion search gets skipped.
        cand[cand_idx].fmv.as_int = INVALID_MV;
      } else {
        // Store start_mv candidate and corresponding ref_mv_idx of full-pel
        // search in the mv stack (except last ref_mv_idx).
        if (mbmi->ref_mv_idx != MAX_REF_MV_SEARCH - 1) {
          assert(args->start_mv_cnt < (MAX_REF_MV_SEARCH - 1) * 2);
          args->start_mv_stack[args->start_mv_cnt] = fmv_cand->as_fullmv;
          args->ref_mv_idx_stack[args->start_mv_cnt] = mbmi->ref_mv_idx;
          args->start_mv_cnt++;
        }
      }
    }
  }

  // Hot fix for asan complaints when resize mode is on. When resize mode is on,
  // the stride of the reference frame can be different from indicated by
  // MotionVectorSearchParams::search_site_cfg. When this happens, we need to
  // readjust the stride.
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_site_cfg =
      av1_get_search_site_config(cpi, x, search_method);

  // Further reduce the search range.
  if (search_range < INT_MAX) {
    const search_site_config *search_site_cfg =
        &src_search_site_cfg[search_method_lookup[search_method]];
    // Max step_param is search_site_cfg->num_search_steps.
    if (search_range < 1) {
      step_param = search_site_cfg->num_search_steps;
    } else {
      while (search_site_cfg->radius[search_site_cfg->num_search_steps -
                                     step_param - 1] > (search_range << 1) &&
             search_site_cfg->num_search_steps - step_param - 1 > 0)
        step_param++;
    }
  }

  int cost_list[5];
  FULLPEL_MV_STATS best_mv_stats;
  int_mv second_best_mv;
  best_mv->as_int = second_best_mv.as_int = INVALID_MV;

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;

  switch (mbmi->motion_mode) {
    case SIMPLE_TRANSLATION: {
      // Perform a search with the top 2 candidates
      int sum_weight = 0;
      for (int m = 0; m < cand_cnt; m++) {
        int_mv smv = cand[m].fmv;
        FULLPEL_MV this_best_mv, this_second_best_mv;
        FULLPEL_MV_STATS this_mv_stats;

        if (smv.as_int == INVALID_MV) continue;

        av1_make_default_fullpel_ms_params(
            &full_ms_params, cpi, x, bsize, &ref_mv, smv.as_fullmv,
            src_search_site_cfg, search_method, fine_search_interval);

        const int thissme =
            av1_full_pixel_search(smv.as_fullmv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list), &this_best_mv,
                                  &this_mv_stats, &this_second_best_mv);

        if (thissme < bestsme) {
          bestsme = thissme;
          best_mv->as_fullmv = this_best_mv;
          best_mv_stats = this_mv_stats;
          second_best_mv.as_fullmv = this_second_best_mv;
        }

        sum_weight += cand[m].weight;
        if (4 * sum_weight > 3 * total_weight) break;
      }
    } break;
    case OBMC_CAUSAL:
      av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                         &ref_mv, start_mv, src_search_site_cfg,
                                         search_method, fine_search_interval);

      bestsme = av1_obmc_full_pixel_search(start_mv, &full_ms_params,
                                           step_param, &best_mv->as_fullmv);
      break;
    default: assert(0 && "Invalid motion mode!\n");
  }
  if (best_mv->as_int == INVALID_MV) return;

  if (scaled_ref_frame) {
    // Swap back the original buffers for subpel motion search.
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[ref_idx] = backup_yv12[i];
    }
  }

  // Terminate search with the current ref_idx based on fullpel mv, rate cost,
  // and other know cost.
  if (cpi->sf.inter_sf.skip_newmv_in_drl >= 2 &&
      mbmi->motion_mode == SIMPLE_TRANSLATION &&
      best_mv->as_int != INVALID_MV) {
    int_mv this_mv;
    this_mv.as_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    const int ref_mv_idx = mbmi->ref_mv_idx;
    const int this_mv_rate =
        av1_mv_bit_cost(&this_mv.as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
    mode_info[ref_mv_idx].full_search_mv.as_int = this_mv.as_int;
    mode_info[ref_mv_idx].full_mv_rate = this_mv_rate;
    mode_info[ref_mv_idx].full_mv_bestsme = bestsme;

    for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
      // Check if the motion search result same as previous results
      if (this_mv.as_int == mode_info[prev_ref_idx].full_search_mv.as_int) {
        // Compare the rate cost
        const int prev_rate_cost = mode_info[prev_ref_idx].full_mv_rate +
                                   mode_info[prev_ref_idx].drl_cost;
        const int this_rate_cost =
            this_mv_rate + mode_info[ref_mv_idx].drl_cost;

        if (prev_rate_cost <= this_rate_cost) {
          // If the current rate_cost is worse than the previous rate_cost, then
          // we terminate the search. Since av1_single_motion_search is only
          // called by handle_new_mv in SIMPLE_TRANSLATION mode, we set the
          // best_mv to INVALID mv to signal that we wish to terminate search
          // for the current mode.
          best_mv->as_int = INVALID_MV;
          return;
        }
      }

      // Terminate the evaluation of current ref_mv_idx based on bestsme and
      // drl_cost.
      const int psme = mode_info[prev_ref_idx].full_mv_bestsme;
      if (psme == INT_MAX) continue;
      const int thr =
          cpi->sf.inter_sf.skip_newmv_in_drl == 3 ? (psme + (psme >> 2)) : psme;
      if (cpi->sf.inter_sf.skip_newmv_in_drl >= 3 &&
          mode_info[ref_mv_idx].full_mv_bestsme > thr &&
          mode_info[prev_ref_idx].drl_cost < mode_info[ref_mv_idx].drl_cost) {
        best_mv->as_int = INVALID_MV;
        return;
      }
    }
  }

  if (cpi->common.features.cur_frame_force_integer_mv) {
    convert_fullmv_to_mv(best_mv);
  }

  const int use_fractional_mv =
      bestsme < INT_MAX && cpi->common.features.cur_frame_force_integer_mv == 0;
  int best_mv_rate = 0;
  int mv_rate_calculated = 0;
  if (use_fractional_mv) {
    int_mv fractional_ms_list[3];
    av1_set_fractional_mv(fractional_ms_list);
    int dis; /* TODO: use dis in distortion calculation later. */

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    MV subpel_start_mv = get_mv_from_fullmv(&best_mv->as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    switch (mbmi->motion_mode) {
      case SIMPLE_TRANSLATION:
        if (mv_sf->use_accurate_subpel_search) {
          const int try_second = second_best_mv.as_int != INVALID_MV &&
                                 second_best_mv.as_int != best_mv->as_int &&
                                 (mv_sf->disable_second_mv <= 1);
          const int best_mv_var = mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], fractional_ms_list);

          if (try_second) {
            struct macroblockd_plane *p = xd->plane;
            const BUFFER_SET orig_dst = {
              { p[0].dst.buf, p[1].dst.buf, p[2].dst.buf },
              { p[0].dst.stride, p[1].dst.stride, p[2].dst.stride },
            };
            int64_t rd = INT64_MAX;
            if (!mv_sf->disable_second_mv) {
              // Calculate actual rd cost.
              mbmi->mv[0].as_mv = best_mv->as_mv;
              av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                            bsize, 0, 0);
              av1_subtract_plane(x, bsize, 0);
              RD_STATS this_rd_stats;
              av1_init_rd_stats(&this_rd_stats);
              av1_estimate_txfm_yrd(cpi, x, &this_rd_stats, INT64_MAX, bsize,
                                    max_txsize_rect_lookup[bsize]);
              int this_mv_rate = av1_mv_bit_cost(
                  &best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                  mv_costs->mv_cost_stack, MV_COST_WEIGHT);
              rd = RDCOST(x->rdmult, this_mv_rate + this_rd_stats.rate,
                          this_rd_stats.dist);
            }

            MV this_best_mv;
            subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
            if (av1_is_subpelmv_in_range(&ms_params.mv_limits,
                                         subpel_start_mv)) {
              unsigned int sse;
              const int this_var = mv_search_params->find_fractional_mv_step(
                  xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv,
                  &dis, &sse, fractional_ms_list);

              if (!mv_sf->disable_second_mv) {
                // If cpi->sf.mv_sf.disable_second_mv is 0, use actual rd cost
                // to choose the better MV.
                mbmi->mv[0].as_mv = this_best_mv;
                av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, &orig_dst,
                                              bsize, 0, 0);
                av1_subtract_plane(x, bsize, 0);
                RD_STATS tmp_rd_stats;
                av1_init_rd_stats(&tmp_rd_stats);
                av1_estimate_txfm_yrd(cpi, x, &tmp_rd_stats, INT64_MAX, bsize,
                                      max_txsize_rect_lookup[bsize]);
                int tmp_mv_rate = av1_mv_bit_cost(
                    &this_best_mv, &ref_mv, mv_costs->nmv_joint_cost,
                    mv_costs->mv_cost_stack, MV_COST_WEIGHT);
                int64_t tmp_rd =
                    RDCOST(x->rdmult, tmp_rd_stats.rate + tmp_mv_rate,
                           tmp_rd_stats.dist);
                if (tmp_rd < rd) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              } else {
                // If cpi->sf.mv_sf.disable_second_mv = 1, use var to decide the
                // best MV.
                if (this_var < best_mv_var) {
                  best_mv->as_mv = this_best_mv;
                  x->pred_sse[ref] = sse;
                }
              }
            }
          }
        } else {
          mv_search_params->find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, &best_mv_stats,
              &best_mv->as_mv, &dis, &x->pred_sse[ref], NULL);
        }
        break;
      case OBMC_CAUSAL:
        av1_find_best_obmc_sub_pixel_tree_up(
            xd, cm, &ms_params, subpel_start_mv, NULL, &best_mv->as_mv, &dis,
            &x->pred_sse[ref], NULL);
        break;
      default: assert(0 && "Invalid motion mode!\n");
    }

    // Terminate search with the current ref_idx based on subpel mv and rate
    // cost.
    if (cpi->sf.inter_sf.skip_newmv_in_drl >= 1 && args != NULL &&
        mbmi->motion_mode == SIMPLE_TRANSLATION &&
        best_mv->as_int != INVALID_MV) {
      const int ref_mv_idx = mbmi->ref_mv_idx;
      best_mv_rate =
          av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                          mv_costs->mv_cost_stack, MV_COST_WEIGHT);
      mv_rate_calculated = 1;

      for (int prev_ref_idx = 0; prev_ref_idx < ref_mv_idx; ++prev_ref_idx) {
        if (!args->single_newmv_valid[prev_ref_idx][ref]) continue;
        // Check if the motion vectors are the same.
        if (best_mv->as_int == args->single_newmv[prev_ref_idx][ref].as_int) {
          // Skip this evaluation if the previous one is skipped.
          if (mode_info[prev_ref_idx].skip) {
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
          // Compare the rate cost that we current know.
          const int prev_rate_cost =
              args->single_newmv_rate[prev_ref_idx][ref] +
              mode_info[prev_ref_idx].drl_cost;
          const int this_rate_cost =
              best_mv_rate + mode_info[ref_mv_idx].drl_cost;

          if (prev_rate_cost <= this_rate_cost) {
            // If the current rate_cost is worse than the previous rate_cost,
            // then we terminate the search for this ref_mv_idx.
            mode_info[ref_mv_idx].skip = 1;
            break;
          }
        }
      }
    }
  }

  if (mv_rate_calculated) {
    *rate_mv = best_mv_rate;
  } else {
    *rate_mv =
        av1_mv_bit_cost(&best_mv->as_mv, &ref_mv, mv_costs->nmv_joint_cost,
                        mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }
}